

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiIniData * FindWindowSettings(char *name)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  value_type *pvVar3;
  ImGuiIniData *ini;
  int i;
  ImGuiID id;
  ImGuiContext *g;
  char *name_local;
  
  pIVar1 = GImGui;
  IVar2 = ImHash(name,0,0);
  ini._0_4_ = 0;
  while( true ) {
    if ((int)ini == (pIVar1->Settings).Size) {
      return (ImGuiIniData *)0x0;
    }
    pvVar3 = ImVector<ImGuiIniData>::operator[](&pIVar1->Settings,(int)ini);
    if (pvVar3->Id == IVar2) break;
    ini._0_4_ = (int)ini + 1;
  }
  return pvVar3;
}

Assistant:

static ImGuiIniData* FindWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i != g.Settings.Size; i++)
    {
        ImGuiIniData* ini = &g.Settings[i];
        if (ini->Id == id)
            return ini;
    }
    return NULL;
}